

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O3

property_ptr __thiscall
dtc::fdt::device_tree::assign_phandle(device_tree *this,node_ptr *n,uint32_t *phandle)

{
  string *psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  iterator iVar6;
  property *ppVar7;
  pointer puVar8;
  key_type *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  int bit;
  int iVar10;
  size_t sVar11;
  ulong uVar12;
  property_ptr pVar13;
  property_value v;
  string local_1d0;
  long *local_1b0;
  long local_1a8;
  long local_1a0 [2];
  undefined1 *local_190;
  long local_188;
  undefined1 local_180;
  undefined7 uStack_17f;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_170;
  value_type local_158;
  undefined1 local_150 [32];
  _Alloc_hider local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  pointer local_110;
  pointer puStack_108;
  pointer local_100;
  value_type local_f8;
  long local_f0;
  undefined1 local_e8 [32];
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  pointer local_a8;
  pointer puStack_a0;
  pointer local_98;
  value_type local_90;
  __buckets_ptr local_88;
  pointer ppStack_80;
  __node_base local_78;
  size_type sStack_70;
  float local_68;
  undefined4 uStack_64;
  size_t local_60;
  __node_base_ptr p_Stack_58;
  _Alloc_hider local_50;
  size_type local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  
  psVar1 = *(string **)phandle;
  local_1b0 = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"phandle","");
  pVar13 = node::get_property((node *)this,psVar1);
  _Var9 = pVar13.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,local_1a0[0] + 1);
    _Var9._M_pi = extraout_RDX;
  }
  lVar4._0_4_ = this->phandle_node_name;
  lVar4._4_1_ = this->valid;
  lVar4._5_1_ = this->garbage_collect;
  lVar4._6_2_ = *(undefined2 *)&this->field_0x6;
  if (lVar4 == 0) {
    psVar1 = *(string **)phandle;
    local_1b0 = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"linux,phandle","");
    pVar13 = node::get_property((node *)&stack0xffffffffffffff78,psVar1);
    _Var9 = pVar13.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              (this->reservations).
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    *(__buckets_ptr *)this = local_88;
    (this->reservations).
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start = ppStack_80;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      _Var9._M_pi = extraout_RDX_00;
    }
    if (local_1b0 != local_1a0) {
      operator_delete(local_1b0,local_1a0[0] + 1);
      _Var9._M_pi = extraout_RDX_01;
    }
    lVar2._0_4_ = this->phandle_node_name;
    lVar2._4_1_ = this->valid;
    lVar2._5_1_ = this->garbage_collect;
    lVar2._6_2_ = *(undefined2 *)&this->field_0x6;
    if (lVar2 == 0) {
      local_48 = 0;
      local_40 = '\0';
      local_1b0 = local_1a0;
      local_50._M_p = &stack0xffffffffffffffc0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b0,&stack0xffffffffffffffc0,&stack0xffffffffffffffc0);
      local_190 = &local_180;
      local_188 = 0;
      local_180 = 0;
      local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_158 = UNKNOWN;
      if (local_50._M_p != &stack0xffffffffffffffc0) {
        operator_delete(local_50._M_p,CONCAT71(uStack_3f,local_40) + 1);
      }
      do {
        iVar6 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<dtc::fdt::node>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<dtc::fdt::node>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<dtc::fdt::node>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<dtc::fdt::node>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)(n + 0x1a),in_RCX);
        uVar5 = *in_RCX;
        *in_RCX = uVar5 + 1;
      } while (iVar6.
               super__Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<dtc::fdt::node>_>,_false>
               ._M_cur != (__node_type *)0x0);
      iVar10 = 0x18;
      do {
        local_88 = (__buckets_ptr)CONCAT71(local_88._1_7_,(char)(uVar5 >> ((byte)iVar10 & 0x1f)));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (&local_170,(uchar *)&stack0xffffffffffffff78);
        iVar10 = iVar10 + -8;
      } while (iVar10 != -8);
      uVar5 = *(uint *)&(n->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      _Var9._M_pi = extraout_RDX_02;
      if ((uVar5 & 0xfffffffd) == 0) {
        ppVar7 = (property *)operator_new(0x78);
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"linux,phandle","");
        local_88 = &stack0xffffffffffffffa8;
        ppStack_80 = (pointer)0x1;
        local_78._M_nxt = (_Hash_node_base *)0x0;
        sStack_70 = 0;
        local_68 = 1.0;
        uStack_64 = 0;
        local_60 = 0;
        p_Stack_58 = (__node_base_ptr)0x0;
        property::property(ppVar7,&local_1d0,(string_set *)&stack0xffffffffffffff78);
        std::__shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>::reset<dtc::fdt::property>
                  ((__shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2> *)this,ppVar7);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)&stack0xffffffffffffff78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        lVar3._0_4_ = this->phandle_node_name;
        lVar3._4_1_ = this->valid;
        lVar3._5_1_ = this->garbage_collect;
        lVar3._6_2_ = *(undefined2 *)&this->field_0x6;
        local_e8._0_8_ = local_e8 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_e8,local_1b0,local_1a8 + (long)local_1b0);
        local_c8._M_p = (pointer)&local_b8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c8,local_190,local_190 + local_188);
        local_a8 = (pointer)0x0;
        puStack_a0 = (pointer)0x0;
        local_98 = (pointer)0x0;
        uVar12 = (long)local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        local_f0 = lVar3;
        if (uVar12 == 0) {
          puVar8 = (pointer)0x0;
          sVar11 = 0;
        }
        else {
          if ((long)uVar12 < 0) {
            std::__throw_bad_alloc();
          }
          puVar8 = (pointer)operator_new(uVar12);
          sVar11 = (long)local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start;
        }
        local_98 = puVar8 + uVar12;
        local_a8 = puVar8;
        if (local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
          puStack_a0 = puVar8;
          memmove(puVar8,local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,sVar11);
        }
        puStack_a0 = puVar8 + sVar11;
        local_90 = local_158;
        std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::push_back
                  ((vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_> *)
                   (local_f0 + 0x58),(value_type *)local_e8);
        if (local_a8 != (pointer)0x0) {
          operator_delete(local_a8,(long)local_98 - (long)local_a8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_p != &local_b8) {
          operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
          operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
        }
        std::
        vector<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
        ::push_back((vector<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
                     *)(*(long *)phandle + 0x88),(value_type *)this);
        uVar5 = *(uint *)&(n->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        ;
        _Var9._M_pi = extraout_RDX_03;
      }
      if (uVar5 - 1 < 2) {
        ppVar7 = (property *)operator_new(0x78);
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"phandle","");
        local_88 = &stack0xffffffffffffffa8;
        ppStack_80 = (pointer)0x1;
        local_78._M_nxt = (_Hash_node_base *)0x0;
        sStack_70 = 0;
        local_68 = 1.0;
        uStack_64 = 0;
        local_60 = 0;
        p_Stack_58 = (__node_base_ptr)0x0;
        property::property(ppVar7,&local_1d0,(string_set *)&stack0xffffffffffffff78);
        std::__shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>::reset<dtc::fdt::property>
                  ((__shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2> *)this,ppVar7);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)&stack0xffffffffffffff78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        lVar4 = *(long *)this;
        local_150._0_8_ = local_150 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_150,local_1b0,local_1a8 + (long)local_1b0);
        local_130._M_p = (pointer)&local_120;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,local_190,local_190 + local_188);
        local_110 = (pointer)0x0;
        puStack_108 = (pointer)0x0;
        local_100 = (pointer)0x0;
        uVar12 = (long)local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        if (uVar12 == 0) {
          puVar8 = (pointer)0x0;
          sVar11 = 0;
        }
        else {
          if ((long)uVar12 < 0) {
            std::__throw_bad_alloc();
          }
          puVar8 = (pointer)operator_new(uVar12);
          sVar11 = (long)local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start;
        }
        local_100 = puVar8 + uVar12;
        local_110 = puVar8;
        if (local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
          puStack_108 = puVar8;
          memmove(puVar8,local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,sVar11);
        }
        puStack_108 = puVar8 + sVar11;
        local_f8 = local_158;
        std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::push_back
                  ((vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_> *)
                   (lVar4 + 0x58),(value_type *)local_150);
        if (local_110 != (pointer)0x0) {
          operator_delete(local_110,(long)local_100 - (long)local_110);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_p != &local_120) {
          operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
          operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
        }
        std::
        vector<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
        ::push_back((vector<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
                     *)(*(long *)phandle + 0x88),(value_type *)this);
        _Var9._M_pi = extraout_RDX_04;
      }
      if (local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_170.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_170.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_170.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        _Var9._M_pi = extraout_RDX_05;
      }
      if (local_190 != &local_180) {
        operator_delete(local_190,CONCAT71(uStack_17f,local_180) + 1);
        _Var9._M_pi = extraout_RDX_06;
      }
      if (local_1b0 != local_1a0) {
        operator_delete(local_1b0,local_1a0[0] + 1);
        _Var9._M_pi = extraout_RDX_07;
      }
    }
  }
  pVar13.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var9._M_pi;
  pVar13.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (property_ptr)pVar13.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

property_ptr
device_tree::assign_phandle(node_ptr n, uint32_t &phandle)
{
	// If there is an existing phandle, use it
	property_ptr p = n->get_property("phandle");
	if (p == 0)
	{
		p = n->get_property("linux,phandle");
	}
	if (p == 0)
	{
		// Otherwise insert a new phandle node
		property_value v;
		while (used_phandles.find(phandle) != used_phandles.end())
		{
			// Note that we only don't need to
			// store this phandle in the set,
			// because we are monotonically
			// increasing the value of phandle and
			// so will only ever revisit this value
			// if we have used 2^32 phandles, at
			// which point our blob won't fit in
			// any 32-bit system and we've done
			// something badly wrong elsewhere
			// already.
			phandle++;
		}
		push_big_endian(v.byte_data, phandle++);
		if (phandle_node_name == BOTH || phandle_node_name == LINUX)
		{
			p.reset(new property("linux,phandle"));
			p->add_value(v);
			n->add_property(p);
		}
		if (phandle_node_name == BOTH || phandle_node_name == EPAPR)
		{
			p.reset(new property("phandle"));
			p->add_value(v);
			n->add_property(p);
		}
	}

	return (p);
}